

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall
QOpenGLFunctions::glFramebufferRenderbuffer
          (QOpenGLFunctions *this,GLenum target,GLenum attachment,GLenum renderbuffertarget,
          GLuint renderbuffer)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  
  (**(code **)(*in_RDI + 0x248))(in_ESI,in_EDX,in_ECX,in_R8D);
  return;
}

Assistant:

inline void QOpenGLFunctions::glFramebufferRenderbuffer(GLenum target, GLenum attachment, GLenum renderbuffertarget, GLuint renderbuffer)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glFramebufferRenderbuffer(target, attachment, renderbuffertarget, renderbuffer);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.FramebufferRenderbuffer(target, attachment, renderbuffertarget, renderbuffer);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}